

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O2

uchar __thiscall Memory::LargeObjectHeader::GetAttributes(LargeObjectHeader *this,uint cookie)

{
  byte bVar1;
  ushort uVar2;
  byte calculatedChecksum;
  uint uVar3;
  
  uVar2 = this->attributesAndChecksum ^ (ushort)cookie;
  uVar3 = cookie ^ *(uint *)&this->next;
  bVar1 = (byte)(uVar2 >> 8);
  calculatedChecksum =
       (byte)(uVar3 >> 0x18) ^ (byte)uVar3 ^ (byte)(uVar3 >> 0x10) ^ (byte)(uVar3 >> 8) ^ bVar1;
  if (calculatedChecksum != (byte)uVar2) {
    LargeHeapBlock_Metadata_Corrupted((ULONG_PTR)this,calculatedChecksum);
    bVar1 = (byte)(this->attributesAndChecksum >> 8) ^ (byte)(cookie >> 8);
  }
  return bVar1;
}

Assistant:

unsigned char
LargeObjectHeader::GetAttributes(uint cookie)
{
#ifdef LARGEHEAPBLOCK_ENCODING

    LargeObjectHeader *decodedNext = this->DecodeNext(cookie, this->next);
    ushort decodedAttributesAndChecksum = this->DecodeAttributesAndChecksum(cookie);

    unsigned char checkSum = (unsigned char)(decodedAttributesAndChecksum & 0xFF);
    unsigned char calculatedCheckSumField = this->CalculateCheckSum(decodedNext, (unsigned char)(decodedAttributesAndChecksum >> 8));
    if (checkSum != calculatedCheckSumField)
    {
        LargeHeapBlock_Metadata_Corrupted((ULONG_PTR)this, calculatedCheckSumField);
    }

    // If checksum matches return the up-to-date attributes (in case other thread changed it from last time
    // we read it in this method.
    return this->DecodeAttributesAndChecksum(cookie) >> 8;
#else
    return this->attributes;
#endif
}